

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::fixent(entity *e,int version)

{
  int iVar1;
  int yaw;
  int version_local;
  entity *e_local;
  
  if ((version < 0xb) && (6 < e->type)) {
    e->type = e->type + '\x01';
  }
  if ((version < 0xd) && (7 < e->type)) {
    e->type = e->type + '\x01';
  }
  if (((version < 0xf) && (1 < e->type)) && (e->type < 0x11)) {
    if (e->type == '\x10') {
      e->type = '\x02';
    }
    else {
      e->type = e->type + '\x01';
    }
  }
  if ((version < 0x15) && (3 < e->type)) {
    e->type = e->type + '\x01';
  }
  if ((version < 0x16) && (4 < e->type)) {
    e->type = e->type + '\x01';
  }
  if ((version < 0x17) && (5 < e->type)) {
    e->type = e->type + '\x01';
  }
  if ((version < 0x18) && (6 < e->type)) {
    e->type = e->type + '\x01';
  }
  if ((version < 0x1f) && ((e->type == '\x02' || (e->type == '\x03')))) {
    e->attr1 = (short)((e->attr1 + 0xb4) % 0x168);
  }
  if ((version < 0x20) && (e->type == '\x02')) {
    iVar1 = ((int)e->attr1 % 0x168 + 0x168) % 0x168 + 7;
    e->attr1 = (short)iVar1 - (short)(iVar1 % 0xf);
  }
  return;
}

Assistant:

static void fixent(entity &e, int version)
    {
        if(version <= 10 && e.type >= 7) e.type++;
        if(version <= 12 && e.type >= 8) e.type++;
        if(version <= 14 && e.type >= ET_MAPMODEL && e.type <= 16)
        {
            if(e.type == 16) e.type = ET_MAPMODEL;
            else e.type++;
        }
        if(version <= 20 && e.type >= ET_ENVMAP) e.type++;
        if(version <= 21 && e.type >= ET_PARTICLES) e.type++;
        if(version <= 22 && e.type >= ET_SOUND) e.type++;
        if(version <= 23 && e.type >= ET_SPOTLIGHT) e.type++;
        if(version <= 30 && (e.type == ET_MAPMODEL || e.type == ET_PLAYERSTART)) e.attr1 = (int(e.attr1)+180)%360;
        if(version <= 31 && e.type == ET_MAPMODEL) { int yaw = (int(e.attr1)%360 + 360)%360 + 7; e.attr1 = yaw - yaw%15; }
    }